

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_misc.c
# Opt level: O2

int lj_cf_misc_sysprof_start(lua_State *L)

{
  char cVar1;
  bool bVar2;
  uint8_t uVar3;
  int iVar4;
  GCtab *t;
  GCstr *pGVar5;
  cTValue *pcVar6;
  ulong uVar7;
  char *pcVar8;
  int *piVar9;
  char *pcVar10;
  long lVar11;
  profile_ctx *ctx;
  luam_Sysprof_Options local_48;
  
  local_48.buf = (uint8_t *)0x0;
  local_48.len = 0;
  local_48.mode = '\0';
  local_48._1_7_ = 0;
  local_48.interval = 0;
  local_48.ctx = (int *)0x0;
  if ((int)((ulong)((long)L->top - (long)L->base) >> 3) == 0) {
    local_48.interval = 10;
    goto LAB_00125154;
  }
  iVar4 = 1;
  t = lj_lib_checktab(L,1);
  pGVar5 = lj_str_new(L,"mode",4);
  pcVar6 = lj_tab_getstr(t,pGVar5);
  if (pcVar6 == (cTValue *)0x0) {
    pcVar8 = (char *)0x0;
LAB_00125183:
    pcVar10 = "D";
    if (pcVar8 != (char *)0x0) {
      pcVar10 = pcVar8;
    }
    cVar1 = *pcVar10;
    if (cVar1 == 'C') {
      uVar3 = '\x02';
LAB_001251d4:
      bVar2 = false;
    }
    else {
      if (cVar1 != 'D') {
        if (cVar1 != 'L') goto LAB_001251a7;
        uVar3 = '\x01';
        goto LAB_001251d4;
      }
      uVar3 = '\0';
      bVar2 = true;
    }
    local_48.mode = uVar3;
    pGVar5 = lj_str_new(L,"interval",8);
    pcVar6 = lj_tab_getstr(t,pGVar5);
    local_48.interval = 10;
    if ((pcVar6 != (cTValue *)0x0) && ((pcVar6->field_2).it < 0xffff0000)) {
      if ((int)pcVar6->n < 1) {
        lVar11 = 0xf63;
        goto LAB_001251ad;
      }
      local_48.interval = (uint64_t)(uint)(int)pcVar6->n;
    }
    if (bVar2) goto LAB_00125154;
    pGVar5 = lj_str_new(L,"path",4);
    pcVar6 = lj_tab_getstr(t,pGVar5);
    if (pcVar6 == (cTValue *)0x0) {
      pcVar8 = "sysprof.bin";
    }
    else {
      if ((pcVar6->field_2).it != 0xfffffffb) {
        lVar11 = 0xf8c;
        goto LAB_001251ad;
      }
      pcVar8 = (char *)((ulong)(pcVar6->u32).lo + 0x10);
    }
    piVar9 = (int *)lj_mem_realloc(L,(void *)0x0,0,0x800010);
    *(ulong *)(piVar9 + 2) = (ulong)(L->glref).ptr32;
    local_48.buf = (uint8_t *)(piVar9 + 4);
    local_48.len = 0x800000;
    local_48.ctx = piVar9;
    iVar4 = open64(pcVar8,0x241,0x1a4);
    if (iVar4 != -1) {
      *piVar9 = iVar4;
LAB_00125154:
      iVar4 = luaM_sysprof_start(L,&local_48);
      if (iVar4 == 0) {
        iVar4 = 1;
        lua_pushboolean(L,1);
      }
      else {
        iVar4 = prof_error(L,iVar4,(char *)0x0);
      }
      return iVar4;
    }
    lVar11 = *(long *)(piVar9 + 2);
    *(int *)(lVar11 + 0x50) = *(int *)(lVar11 + 0x50) + -0x800010;
    *(long *)(lVar11 + 0x90) = *(long *)(lVar11 + 0x90) + 0x800010;
    (**(code **)(lVar11 + 0x40))(*(undefined8 *)(lVar11 + 0x48),piVar9,0x800010,0);
    iVar4 = 4;
  }
  else {
    if ((((pcVar6->field_2).it == 0xfffffffb) &&
        (uVar7 = (ulong)(pcVar6->u32).lo, *(char *)(uVar7 + 0x10) != '\0')) &&
       (*(char *)(uVar7 + 0x11) == '\0')) {
      pcVar8 = (char *)(uVar7 + 0x10);
      goto LAB_00125183;
    }
LAB_001251a7:
    lVar11 = 0xf3d;
LAB_001251ad:
    pcVar8 = lj_err_allmsg + lVar11;
  }
  iVar4 = prof_error(L,iVar4,pcVar8);
  return iVar4;
}

Assistant:

LJLIB_CF(misc_sysprof_start)
{
#if !LJ_HASSYSPROF
  const char *err_details = err2msg(LJ_ERR_PROF_DETAILS_DISABLED);
  return prof_error(L, PROFILE_ERRUSE, err_details);
#else
  int status = PROFILE_SUCCESS;

  struct luam_Sysprof_Options opt = {};
  const char *err_details = NULL;

  status = parse_sysprof_opts(L, &opt, &err_details);
  if (LJ_UNLIKELY(status != PROFILE_SUCCESS))
    return prof_error(L, status, err_details);

  status = luaM_sysprof_start(L, &opt);
  if (LJ_UNLIKELY(status != PROFILE_SUCCESS))
    /* Allocated memory will be freed in on_stop callback. */
    return prof_error(L, status, err_details);

  lua_pushboolean(L, 1);
  return 1;
#endif /* !LJ_HASSYSPROF */
}